

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorReplaceArray(gdImagePtr im,int len,int *src,int *dst)

{
  bool bVar1;
  int iVar2;
  void *__base;
  void *pvVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int c;
  uint local_3c;
  size_t local_38;
  
  if (src == dst || len < 1) {
    return 0;
  }
  if (len == 1) {
    iVar2 = gdImageColorReplace(im,*src,*dst);
    return iVar2;
  }
  iVar2 = overflow2(len,8);
  if (iVar2 != 0) {
    return -1;
  }
  local_38 = (size_t)(uint)len;
  __base = gdMalloc(local_38 * 8);
  if (__base == (void *)0x0) {
    return -1;
  }
  if (0 < len) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      *(undefined4 *)((long)__base + (lVar4 >> 0x1e)) = *(undefined4 *)((long)src + lVar6 * 2);
      *(undefined4 *)((long)__base + (long)((int)lVar6 + 1) * 4) =
           *(undefined4 *)((long)dst + lVar6 * 2);
      lVar6 = lVar6 + 2;
      lVar4 = lVar4 + 0x200000000;
    } while (local_38 * 2 != lVar6);
  }
  qsort(__base,local_38,8,colorCmp);
  iVar2 = im->cy1;
  if (im->trueColor == 0) {
    if (iVar2 <= im->cy2) {
      iVar5 = 0;
      lVar4 = (long)iVar2;
      do {
        iVar2 = im->cx1;
        if (iVar2 <= im->cx2) {
          lVar6 = (long)iVar2 + -1;
          do {
            local_3c = (uint)im->pixels[lVar4][lVar6 + 1];
            pvVar3 = bsearch(&local_3c,__base,local_38,8,colorCmp);
            if (pvVar3 != (void *)0x0) {
              gdImageSetPixel(im,iVar2,(int)lVar4,*(int *)((long)pvVar3 + 4));
              iVar5 = iVar5 + 1;
            }
            lVar6 = lVar6 + 1;
            iVar2 = iVar2 + 1;
          } while (lVar6 < im->cx2);
        }
        bVar1 = lVar4 < im->cy2;
        lVar4 = lVar4 + 1;
      } while (bVar1);
      goto LAB_0010bee3;
    }
  }
  else if (iVar2 <= im->cy2) {
    iVar5 = 0;
    lVar4 = (long)iVar2;
    do {
      iVar2 = im->cx1;
      if (iVar2 <= im->cx2) {
        lVar6 = (long)iVar2 + -1;
        do {
          local_3c = im->tpixels[lVar4][lVar6 + 1];
          pvVar3 = bsearch(&local_3c,__base,local_38,8,colorCmp);
          if (pvVar3 != (void *)0x0) {
            gdImageSetPixel(im,iVar2,(int)lVar4,*(int *)((long)pvVar3 + 4));
            iVar5 = iVar5 + 1;
          }
          lVar6 = lVar6 + 1;
          iVar2 = iVar2 + 1;
        } while (lVar6 < im->cx2);
      }
      bVar1 = lVar4 < im->cy2;
      lVar4 = lVar4 + 1;
    } while (bVar1);
    goto LAB_0010bee3;
  }
  iVar5 = 0;
LAB_0010bee3:
  gdFree(__base);
  return iVar5;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceArray (gdImagePtr im, int len, int *src, int *dst)
{
	register int x, y;
	int c, *d, *base;
	int i, n = 0;

	if (len <= 0 || src == dst) {
		return 0;
	}
	if (len == 1) {
		return gdImageColorReplace(im, src[0], dst[0]);
	}
	if (overflow2(len, sizeof(int)<<1)) {
		return -1;
	}
	base = (int *)gdMalloc(len * (sizeof(int)<<1));
	if (!base) {
		return -1;
	}
	for (i = 0; i < len; i++) {
		base[(i<<1)]   = src[i];
		base[(i<<1)+1] = dst[i];
	}
	qsort(base, len, sizeof(int)<<1, colorCmp);

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				c = pixel(im, x, y);									\
				if ( (d = (int *)bsearch(&c, base, len, sizeof(int)<<1, colorCmp)) ) { \
					gdImageSetPixel(im, x, y, d[1]);					\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	gdFree(base);
	return n;
}